

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void __thiscall wasm::GlobalTypeRewriter::update(GlobalTypeRewriter *this)

{
  TypeBuilder *this_00;
  list<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *plVar1;
  __index_type *this_01;
  __node_base *this_02;
  pointer pHVar2;
  Signature signature;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  undefined8 uVar5;
  pointer pFVar6;
  bool bVar7;
  int iVar8;
  bool *pbVar9;
  iterator iVar10;
  uint *puVar11;
  size_type sVar12;
  size_t sVar13;
  Type *pTVar14;
  Struct *__x;
  Type TVar15;
  Type TVar16;
  undefined4 extraout_var;
  iterator iVar17;
  HeapType other;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar18;
  mapped_type *pmVar19;
  iterator iVar20;
  mapped_type *this_03;
  Fatal *this_04;
  byte extraout_DL;
  key_type *__k;
  uint uVar21;
  _List_node_base *p_Var22;
  size_type *psVar23;
  Field *field;
  ulong uVar24;
  undefined1 auVar25 [8];
  _List_node_base *p_Var26;
  optional<wasm::HeapType> oVar27;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar28;
  undefined1 auStack_2a8 [8];
  TypeMap oldToNewTypes;
  _Hash_node_base _Stack_260;
  InsertOrderedMap<wasm::HeapType,_bool> local_258;
  GlobalTypeRewriter *pGStack_208;
  undefined1 local_120 [8];
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> privateTypes;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_f0;
  undefined1 local_d8 [8];
  Signature sig;
  Signature newSig;
  _List_node_base *local_b0;
  iterator __end1;
  undefined1 auStack_78 [8];
  BuildResult buildResults;
  Iterator __begin3;
  
  wasm::ModuleUtils::getPrivateHeapTypes
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_120,this->wasm);
  this_02 = &oldToNewTypes._M_h._M_before_begin;
  auStack_2a8 = (undefined1  [8])0x0;
  oldToNewTypes._M_h._M_buckets = (__buckets_ptr)0x0;
  oldToNewTypes._M_h._M_bucket_count = 0;
  oldToNewTypes._M_h._M_before_begin._M_nxt = &_Stack_260;
  oldToNewTypes._M_h._M_element_count = 1;
  oldToNewTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  oldToNewTypes._M_h._M_rehash_policy._4_4_ = 0;
  oldToNewTypes._M_h._M_rehash_policy._M_next_resize = 0;
  oldToNewTypes._M_h._M_single_bucket._0_4_ = 0x3f800000;
  _Stack_260._M_nxt = (_Hash_node_base *)0x0;
  local_258.Map._M_h._M_buckets = &local_258.Map._M_h._M_single_bucket;
  local_258.Map._M_h._M_bucket_count = 1;
  local_258.Map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_258.Map._M_h._M_element_count = 0;
  local_258.Map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_258.Map._M_h._M_rehash_policy._M_next_resize = 0;
  local_258.Map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_258.List.
  super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_258.List;
  local_258.List.
  super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_258.List;
  local_258.List.
  super__List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
  ._M_impl._M_node._M_size = 0;
  for (; local_120 !=
         (undefined1  [8])
         privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_start; local_120 = (undefined1  [8])((long)local_120 + 8)) {
    auStack_78 = (undefined1  [8])((pointer)local_120)->id;
    pbVar9 = InsertOrderedMap<wasm::HeapType,_bool>::operator[](&local_258,(HeapType *)auStack_78);
    *pbVar9 = false;
  }
  p_Var26 = (_List_node_base *)&local_258.List;
  p_Var22 = p_Var26;
  while (p_Var22 = (((_List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
                      *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var22 != p_Var26) {
    auStack_78 = *(undefined1 (*) [8])(p_Var22 + 1);
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         p_Var22[1]._M_prev;
    oVar27 = HeapType::getSuperType((HeapType *)auStack_78);
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         oVar27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType>._M_payload;
    if ((((undefined1  [16])
          oVar27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
         (undefined1  [16])0x0) &&
       (iVar10 = InsertOrderedMap<wasm::HeapType,_bool>::find
                           (&local_258,
                            (HeapType *)
                            &buildResults.
                             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             .
                             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             .
                             super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             .
                             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                             ._M_index), iVar10._M_node != p_Var26)) {
      *(undefined1 *)&iVar10._M_node[1]._M_prev = 1;
    }
  }
  while (p_Var26 = (((_List_base<std::pair<const_wasm::HeapType,_bool>,_std::allocator<std::pair<const_wasm::HeapType,_bool>_>_>
                      *)&p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var26 != (_List_node_base *)&local_258.List) {
    if (((ulong)p_Var26[1]._M_prev & 1) == 0) {
      TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
      ::push((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
              *)auStack_2a8,(HeapType)*(uintptr_t *)(p_Var26 + 1));
    }
  }
  pGStack_208 = this;
  TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>::
  stepToNext((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
              *)auStack_2a8);
  uVar21 = 0;
  do {
    if (auStack_2a8 == (undefined1  [8])oldToNewTypes._M_h._M_buckets) {
      HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>::~SupertypesFirstBase
                ((SupertypesFirstBase<SupertypesFirst> *)auStack_2a8);
      sVar13 = (this->typeIndices).Map._M_h._M_element_count;
      if (sVar13 != 0) {
        this_00 = &this->typeBuilder;
        TypeBuilder::grow(this_00,sVar13);
        sVar13 = TypeBuilder::size(this_00);
        uVar24 = 0;
        TypeBuilder::createRecGroup(this_00,0,sVar13);
        plVar1 = &(this->typeIndices).List;
        this_01 = &buildResults.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._M_index;
        local_b0 = (_List_node_base *)plVar1;
        while (local_b0 = (((_List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                             *)&local_b0->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              local_b0 != (_List_node_base *)plVar1) {
          __end1._M_node = local_b0[1]._M_next;
          bVar7 = HeapType::isSignature((HeapType *)&__end1);
          if (bVar7) {
            _local_d8 = HeapType::getSignature((HeapType *)&__end1);
            auStack_2a8 = (undefined1  [8])0x0;
            oldToNewTypes._M_h._M_buckets = (__buckets_ptr)0x0;
            oldToNewTypes._M_h._M_bucket_count = 0;
            auStack_78 = (undefined1  [8])0x0;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._0_8_ = 0;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._8_8_ = 0;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            _24_8_ = local_d8;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            PVar28 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                     wasm::Type::end((Type *)buildResults.
                                             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             ._24_8_);
            for (; PVar3.index = (size_t)__begin3.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .parent,
                PVar3.parent = (Type *)buildResults.
                                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       ._24_8_, PVar28 != PVar3;
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1)) {
              pTVar14 = wasm::Type::Iterator::operator*((Iterator *)this_01);
              local_f0._M_impl.super__Vector_impl_data._M_start =
                   (pointer)getTempType(this,(Type)pTVar14->id);
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_2a8,
                         (Type *)&local_f0);
            }
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            _24_8_ = &sig;
            __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
                 (Type *)0x0;
            PVar28 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                     wasm::Type::end((Type *)buildResults.
                                             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             .
                                             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                             ._24_8_);
            for (; PVar4.index = (size_t)__begin3.
                                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         .parent,
                PVar4.parent = (Type *)buildResults.
                                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       ._24_8_, PVar28 != PVar4;
                __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                     = (Type *)((long)&(__begin3.
                                        super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                       .parent)->id + 1)) {
              pTVar14 = wasm::Type::Iterator::operator*((Iterator *)this_01);
              local_f0._M_impl.super__Vector_impl_data._M_start =
                   (pointer)getTempType(this,(Type)pTVar14->id);
              std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78,
                         (Type *)&local_f0);
            }
            Tuple::Tuple((Tuple *)this_01,(TypeList *)auStack_2a8);
            TVar15 = TypeBuilder::getTempTupleType(this_00,(Tuple *)this_01);
            Tuple::Tuple((Tuple *)&local_f0,(TypeList *)auStack_78);
            TVar16 = TypeBuilder::getTempTupleType(this_00,(Tuple *)&local_f0);
            sig.results = TVar15;
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_f0);
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)this_01);
            (*this->_vptr_GlobalTypeRewriter[4])(this,__end1._M_node,&sig.results);
            signature.results.id = TVar16.id;
            signature.params.id = sig.results.id;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            _24_8_ = this_00;
            TypeBuilder::Entry::operator=((Entry *)this_01,signature);
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_78);
            std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                      ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_2a8);
          }
          else {
            bVar7 = HeapType::isStruct((HeapType *)&__end1);
            if (bVar7) {
              __x = HeapType::getStruct((HeapType *)&__end1);
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                        ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2a8,
                         &__x->fields);
              std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                        ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_78,
                         (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2a8);
              uVar5 = buildResults.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._M_u._0_8_;
              for (auVar25 = auStack_78; auVar25 != (undefined1  [8])uVar5;
                  auVar25 = (undefined1  [8])((long)auVar25 + 0x10)) {
                TVar15 = getTempType(this,*(uintptr_t *)
                                           &(((TypeBuilder *)auVar25)->impl)._M_t.
                                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>
                                    );
                (((TypeBuilder *)auVar25)->impl)._M_t.
                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                ._M_t.
                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> =
                     (_Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>)TVar15.id;
              }
              (*this->_vptr_GlobalTypeRewriter[2])
                        (this,__end1._M_node,
                         (_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_78);
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _24_8_ = this_00;
              TypeBuilder::Entry::operator=((Entry *)this_01,(Struct *)auStack_78);
              std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                        ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_78);
              std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
                        ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2a8);
            }
            else {
              bVar7 = HeapType::isArray((HeapType *)&__end1);
              if (!bVar7) {
                handle_unreachable("bad type",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                                   ,0x67);
              }
              HeapType::getArray((HeapType *)auStack_2a8);
              auStack_78 = auStack_2a8;
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_u._0_8_ = oldToNewTypes._M_h._M_buckets;
              auStack_78 = (undefined1  [8])getTempType(this,(Type)auStack_2a8);
              (*this->_vptr_GlobalTypeRewriter[3])(this,__end1._M_node,auStack_78);
              privateTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_78;
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _24_8_ = this_00;
              TypeBuilder::Entry::operator=
                        ((Entry *)this_01,
                         (Array *)&privateTypes.
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
          iVar8 = (*this->_vptr_GlobalTypeRewriter[5])(this,__end1._M_node);
          auStack_2a8 = (undefined1  [8])CONCAT44(extraout_var,iVar8);
          oldToNewTypes._M_h._M_buckets =
               (__buckets_ptr)CONCAT71(oldToNewTypes._M_h._M_buckets._1_7_,extraout_DL);
          if ((extraout_DL & 1) != 0) {
            iVar17 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::find
                               (&this->typeIndices,(HeapType *)auStack_2a8);
            if (iVar17._M_node == (_List_node_base *)plVar1) {
              auStack_78 = (undefined1  [8])this_00;
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_u._0_8_ = uVar24;
              TypeBuilder::Entry::subTypeOf((Entry *)auStack_78,(HeapType)auStack_2a8);
            }
            else {
              if ((uint)uVar24 <= *(uint *)&iVar17._M_node[1]._M_prev) {
                __assert_fail("it->second < i",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/type-updating.cpp"
                              ,0x6d,"void wasm::GlobalTypeRewriter::update()");
              }
              auStack_78 = (undefined1  [8])this_00;
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_u._0_8_ = uVar24;
              buildResults.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _24_8_ = this_00;
              other = TypeBuilder::Entry::operator_cast_to_HeapType((Entry *)this_01);
              TypeBuilder::Entry::subTypeOf((Entry *)auStack_78,other);
            }
          }
          uVar24 = (ulong)((uint)uVar24 + 1);
        }
        TypeBuilder::build((BuildResult *)auStack_78,this_00);
        if (buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._M_first._M_storage._M_storage[0x10] == '\x01') {
          Fatal::Fatal((Fatal *)auStack_2a8);
          std::operator<<((ostream *)&oldToNewTypes._M_h._M_bucket_count,
                          "Internal GlobalTypeRewriter build error: ");
          this_04 = Fatal::operator<<((Fatal *)auStack_2a8,(ErrorReason *)&buildResults);
          std::operator<<((ostream *)&this_04->field_0x10," at index ");
          Fatal::operator<<(this_04,(unsigned_long *)auStack_78);
          Fatal::~Fatal((Fatal *)auStack_2a8);
        }
        pvVar18 = std::
                  get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                            ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              *)auStack_78);
        auStack_2a8 = (undefined1  [8])&oldToNewTypes._M_h._M_rehash_policy._M_next_resize;
        oldToNewTypes._M_h._M_buckets = (__buckets_ptr)0x1;
        psVar23 = &oldToNewTypes._M_h._M_bucket_count;
        oldToNewTypes._M_h._M_bucket_count = 0;
        oldToNewTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        oldToNewTypes._M_h._M_element_count =
             CONCAT44(oldToNewTypes._M_h._M_element_count._4_4_,0x3f800000);
        oldToNewTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
        oldToNewTypes._M_h._M_rehash_policy._4_4_ = 0;
        oldToNewTypes._M_h._M_rehash_policy._M_next_resize = 0;
        p_Var26 = (_List_node_base *)plVar1;
        while (p_Var26 = (((_List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                            *)&p_Var26->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var26 != (_List_node_base *)plVar1) {
          buildResults.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
               = p_Var26[1]._M_next;
          p_Var22 = p_Var26[1]._M_prev;
          pHVar2 = (pvVar18->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pmVar19 = std::__detail::
                    _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_2a8,
                                 (key_type *)
                                 &buildResults.
                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  ._M_index);
          pmVar19->id = pHVar2[(ulong)p_Var22 & 0xffffffff].id;
        }
        while (psVar23 = (size_type *)*psVar23, psVar23 != (size_type *)0x0) {
          iVar20 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->wasm->typeNames)._M_h,(key_type *)(psVar23 + 1));
          if (iVar20.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
              _M_cur != (__node_type *)0x0) {
            this_03 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&this->wasm->typeNames,(key_type *)(psVar23 + 2));
            TypeNames::operator=
                      (this_03,(TypeNames *)
                               ((long)iVar20.
                                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                      ._M_cur + 0x10));
          }
        }
        mapTypes(this,(TypeMap *)auStack_2a8);
        std::
        _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)auStack_2a8);
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                             *)auStack_78);
      }
      std::_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~_Vector_base
                ((_Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_120);
      return;
    }
    auStack_78 = (undefined1  [8])oldToNewTypes._M_h._M_buckets[-1];
    puVar11 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::operator[]
                        (&this->typeIndices,(HeapType *)auStack_78);
    *puVar11 = uVar21;
    std::__detail::
    _Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)this_02,(value_type *)(oldToNewTypes._M_h._M_buckets + -1));
    uVar21 = uVar21 + 1;
    do {
      pFVar6 = (pointer)(oldToNewTypes._M_h._M_buckets + -1);
      if (auStack_2a8 == (undefined1  [8])pFVar6) break;
      __k = (key_type *)(oldToNewTypes._M_h._M_buckets + -2);
      oldToNewTypes._M_h._M_buckets = (__buckets_ptr)pFVar6;
      sVar12 = std::
               _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               ::count((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)this_02,__k);
      pFVar6 = (pointer)oldToNewTypes._M_h._M_buckets;
    } while (sVar12 != 0);
    oldToNewTypes._M_h._M_buckets = (__buckets_ptr)pFVar6;
    TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>::
    stepToNext((TopologicalSort<wasm::HeapType,_wasm::HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst>_>
                *)auStack_2a8);
  } while( true );
}

Assistant:

void GlobalTypeRewriter::update() {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder. Sort the private types so that supertypes
  // come before their subtypes.
  Index i = 0;
  auto privateTypes = ModuleUtils::getPrivateHeapTypes(wasm);

  // Topological sort to have supertypes first, but we have to account for the
  // fact that we may be replacing the supertypes to get the order correct.
  struct SupertypesFirst
    : HeapTypeOrdering::SupertypesFirstBase<SupertypesFirst> {
    GlobalTypeRewriter& parent;

    SupertypesFirst(GlobalTypeRewriter& parent,
                    const std::vector<HeapType>& types)
      : SupertypesFirstBase(types), parent(parent) {}
    std::optional<HeapType> getSuperType(HeapType type) {
      return parent.getSuperType(type);
    }
  };

  for (auto type : SupertypesFirst(*this, privateTypes)) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return;
  }
  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  for (auto [type, _] : typeIndices) {
    if (type.isSignature()) {
      auto sig = type.getSignature();
      TypeList newParams, newResults;
      for (auto t : sig.params) {
        newParams.push_back(getTempType(t));
      }
      for (auto t : sig.results) {
        newResults.push_back(getTempType(t));
      }
      Signature newSig(typeBuilder.getTempTupleType(newParams),
                       typeBuilder.getTempTupleType(newResults));
      modifySignature(type, newSig);
      typeBuilder[i] = newSig;
    } else if (type.isStruct()) {
      auto struct_ = type.getStruct();
      // Start with a copy to get mutability/packing/etc.
      auto newStruct = struct_;
      for (auto& field : newStruct.fields) {
        field.type = getTempType(field.type);
      }
      modifyStruct(type, newStruct);
      typeBuilder[i] = newStruct;
    } else if (type.isArray()) {
      auto array = type.getArray();
      // Start with a copy to get mutability/packing/etc.
      auto newArray = array;
      newArray.element.type = getTempType(newArray.element.type);
      modifyArray(type, newArray);
      typeBuilder[i] = newArray;
    } else {
      WASM_UNREACHABLE("bad type");
    }

    // Apply a super, if there is one
    if (auto super = getSuperType(type)) {
      if (auto it = typeIndices.find(*super); it != typeIndices.end()) {
        assert(it->second < i);
        typeBuilder[i].subTypeOf(typeBuilder[it->second]);
      } else {
        typeBuilder[i].subTypeOf(*super);
      }
    }
    i++;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }

  // Update type names (doing it before mapTypes can help debugging there, but
  // has no other effect; mapTypes does not look at type names).
  for (auto& [old, new_] : oldToNewTypes) {
    if (auto it = wasm.typeNames.find(old); it != wasm.typeNames.end()) {
      wasm.typeNames[new_] = it->second;
    }
  }

  mapTypes(oldToNewTypes);
}